

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
fixedPreciseMeasurement_opsV2_Test::TestBody(fixedPreciseMeasurement_opsV2_Test *this)

{
  unit_data *puVar1;
  unit_data *puVar2;
  unit_data *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool bVar3;
  char *pcVar4;
  fixed_precise_measurement *val;
  char *in_R9;
  AssertHelper local_638;
  Message local_630;
  double local_628;
  double local_620;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_6;
  fixed_precise_measurement v;
  Message local_5e8;
  double local_5e0;
  double local_5d8;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_5;
  Message local_5b8;
  double local_5b0;
  double local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_4;
  fixed_precise_measurement fm3;
  AssertHelper local_558;
  Message local_550;
  precise_measurement local_548;
  bool local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_4f8;
  Message local_4f0;
  bool local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar__6;
  precise_measurement m3;
  fixed_precise_measurement spd;
  precise_measurement m1;
  AssertHelper local_468;
  Message local_460;
  precise_unit local_458;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__5;
  Message local_428;
  double local_420;
  double local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_3e8 [8];
  precise_measurement rat;
  AssertHelper local_3b0;
  Message local_3a8;
  precise_unit local_3a0;
  bool local_389;
  undefined1 local_388 [8];
  AssertionResult gtest_ar__4;
  Message local_370;
  double local_368;
  double local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_330 [8];
  fixed_precise_measurement diff;
  AssertHelper local_2f8;
  Message local_2f0;
  precise_measurement local_2e8;
  fixed_precise_measurement local_2d0;
  precise_measurement local_2b8;
  fixed_precise_measurement local_2a0;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_250;
  Message local_248;
  precise_unit local_240;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__2;
  Message local_210;
  double local_208;
  double local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_1d0 [8];
  fixed_precise_measurement sum;
  AssertHelper local_198;
  Message local_190;
  precise_measurement local_188;
  precise_measurement local_170;
  precise_measurement local_158;
  precise_measurement local_140;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f0;
  Message local_e8;
  unit local_e0;
  precise_unit local_d8;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  Message local_a8 [3];
  double local_90;
  double local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_58 [8];
  precise_measurement area;
  fixed_precise_measurement d2;
  fixed_precise_measurement d1;
  fixedPreciseMeasurement_opsV2_Test *this_local;
  
  puVar1 = &d2.units_.base_units_;
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)puVar1,45.0,(precise_unit *)units::precise::m);
  puVar2 = &area.units_.base_units_;
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)puVar2,79.0,(precise_unit *)units::precise::m);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            ((precise_measurement *)&gtest_ar.message_,(fixed_precise_measurement *)puVar2);
  units::fixed_precise_measurement::operator*
            ((precise_measurement *)local_58,(fixed_precise_measurement *)puVar1,
             (precise_measurement *)&gtest_ar.message_);
  local_88 = units::precise_measurement::value((precise_measurement *)local_58);
  local_90 = 3555.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_80,"area.value()","45.0 * 79",&local_88,&local_90);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar3) {
    testing::Message::Message(local_a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_d8 = units::precise_measurement::units((precise_measurement *)local_58);
  local_e0 = units::unit::operator*((unit *)&units::m,(unit *)&units::m);
  local_c1 = units::precise_unit::operator==(&local_d8,&local_e0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar3) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_c0,
               (AssertionResult *)"area.units() == m * m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  puVar1 = &area.units_.base_units_;
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_158,(fixed_precise_measurement *)puVar1);
  puVar2 = &d2.units_.base_units_;
  units::fixed_precise_measurement::operator*
            (&local_140,(fixed_precise_measurement *)puVar2,&local_158);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_188,(fixed_precise_measurement *)puVar2);
  units::fixed_precise_measurement::operator*
            (&local_170,(fixed_precise_measurement *)puVar1,&local_188);
  local_121 = units::precise_measurement::operator==(&local_140,&local_170);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar3) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sum.units_.base_units_,(internal *)local_120,
               (AssertionResult *)"d1 * d2 == d2 * d1","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&sum.units_.base_units_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            ((precise_measurement *)&gtest_ar_1.message_,
             (fixed_precise_measurement *)&area.units_.base_units_);
  units::fixed_precise_measurement::operator+
            ((fixed_precise_measurement *)local_1d0,
             (fixed_precise_measurement *)&d2.units_.base_units_,
             (precise_measurement *)&gtest_ar_1.message_);
  local_200 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_1d0);
  local_208 = 124.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1f8,"sum.value()","45.0 + 79.0",&local_200,&local_208);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar3) {
    testing::Message::Message(&local_210);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_240 = units::fixed_precise_measurement::units((fixed_precise_measurement *)local_1d0);
  local_229 = units::precise_unit::operator==(&local_240,(unit *)&units::m);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar3) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_228,
               (AssertionResult *)"sum.units() == m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  puVar1 = &area.units_.base_units_;
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_2b8,(fixed_precise_measurement *)puVar1);
  puVar2 = &d2.units_.base_units_;
  units::fixed_precise_measurement::operator+
            (&local_2a0,(fixed_precise_measurement *)puVar2,&local_2b8);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_2e8,(fixed_precise_measurement *)puVar2);
  units::fixed_precise_measurement::operator+
            (&local_2d0,(fixed_precise_measurement *)puVar1,&local_2e8);
  local_281 = units::fixed_precise_measurement::operator==(&local_2a0,&local_2d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar3) {
    testing::Message::Message(&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&diff.units_.base_units_,(internal *)local_280,
               (AssertionResult *)"d1 + d2 == d2 + d1","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&diff.units_.base_units_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            ((precise_measurement *)&gtest_ar_2.message_,
             (fixed_precise_measurement *)&d2.units_.base_units_);
  units::fixed_precise_measurement::operator-
            ((fixed_precise_measurement *)local_330,
             (fixed_precise_measurement *)&area.units_.base_units_,
             (precise_measurement *)&gtest_ar_2.message_);
  local_360 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_330);
  local_368 = 34.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_358,"diff.value()","79.0 - 45",&local_360,&local_368);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar3) {
    testing::Message::Message(&local_370);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2dc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  local_3a0 = units::fixed_precise_measurement::units((fixed_precise_measurement *)local_330);
  local_389 = units::precise_unit::operator==(&local_3a0,(unit *)&units::m);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_388,&local_389,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar3) {
    testing::Message::Message(&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rat.units_.base_units_,(internal *)local_388,
               (AssertionResult *)"diff.units() == m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2dd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    std::__cxx11::string::~string((string *)&rat.units_.base_units_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            ((precise_measurement *)&gtest_ar_3.message_,
             (fixed_precise_measurement *)&area.units_.base_units_);
  units::fixed_precise_measurement::operator/
            ((precise_measurement *)local_3e8,(fixed_precise_measurement *)&d2.units_.base_units_,
             (precise_measurement *)&gtest_ar_3.message_);
  local_418 = units::precise_measurement::value((precise_measurement *)local_3e8);
  local_420 = 0.569620253164557;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_410,"rat.value()","45.0 / 79",&local_418,&local_420);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar3) {
    testing::Message::Message(&local_428);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  local_458 = units::precise_measurement::units((precise_measurement *)local_3e8);
  local_441 = units::precise_unit::operator==(&local_458,(unit *)&units::ratio);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,&local_441,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar3) {
    testing::Message::Message(&local_460);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&m1.units_.base_units_,(internal *)local_440,
               (AssertionResult *)"rat.units() == ratio","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    std::__cxx11::string::~string((string *)&m1.units_.base_units_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  puVar2 = &spd.units_.base_units_;
  puVar1 = &area.units_.base_units_;
  units::fixed_precise_measurement::operator/
            ((precise_measurement *)puVar2,(fixed_precise_measurement *)puVar1,
             (precise_unit *)units::precise::s);
  this_00 = &m3.units_.base_units_;
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)this_00,(precise_measurement *)puVar2);
  units::fixed_precise_measurement::operator*
            ((precise_measurement *)&gtest_ar__6.message_,(fixed_precise_measurement *)this_00,
             (precise_unit *)units::precise::s);
  local_4e1 = units::fixed_precise_measurement::operator==
                        ((fixed_precise_measurement *)puVar1,
                         (precise_measurement *)&gtest_ar__6.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e0,&local_4e1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar3) {
    testing::Message::Message(&local_4f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_4e0,(AssertionResult *)"d2 == m3",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_548,(fixed_precise_measurement *)&area.units_.base_units_);
  local_529 = units::precise_measurement::operator==
                        ((precise_measurement *)&gtest_ar__6.message_,&local_548);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_528,&local_529,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar3) {
    testing::Message::Message(&local_550);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fm3.units_.base_units_,(internal *)local_528,(AssertionResult *)"m3 == d2"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    std::__cxx11::string::~string((string *)&fm3.units_.base_units_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  this_01 = &gtest_ar_4.message_;
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)this_01,2.0,(precise_unit *)units::precise::m);
  units::fixed_precise_measurement::operator*=((fixed_precise_measurement *)this_01,2.0);
  local_5a8 = units::fixed_precise_measurement::value((fixed_precise_measurement *)this_01);
  local_5b0 = 4.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_5a0,"fm3.value()","4.0",&local_5a8,&local_5b0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar3) {
    testing::Message::Message(&local_5b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ec,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  units::fixed_precise_measurement::operator/=
            ((fixed_precise_measurement *)&gtest_ar_4.message_,4.0);
  local_5d8 = units::fixed_precise_measurement::value
                        ((fixed_precise_measurement *)&gtest_ar_4.message_);
  local_5e0 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_5d0,"fm3.value()","1.0",&local_5d8,&local_5e0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar3) {
    testing::Message::Message(&local_5e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ee,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v.units_.base_units_,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v.units_.base_units_);
    testing::Message::~Message(&local_5e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  val = units::fixed_precise_measurement::operator*=
                  ((fixed_precise_measurement *)&gtest_ar_4.message_,2.0);
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)&gtest_ar_6.message_,val);
  local_620 = units::fixed_precise_measurement::value
                        ((fixed_precise_measurement *)&gtest_ar_6.message_);
  local_628 = 2.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_618,"v.value()","2.0",&local_620,&local_628);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar3) {
    testing::Message::Message(&local_630);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2f1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, opsV2)
{
    fixed_precise_measurement d1(45.0, precise::m);
    fixed_precise_measurement d2(79, precise::m);

    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == m * m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79);
    EXPECT_TRUE(rat.units() == ratio);

    auto m1 = d2 / precise::s;
    fixed_precise_measurement spd(m1);
    auto m3 = spd * precise::s;

    EXPECT_TRUE(d2 == m3);
    EXPECT_TRUE(m3 == d2);

    fixed_precise_measurement fm3(2.0, precise::m);
    fm3 *= 2.0;
    EXPECT_EQ(fm3.value(), 4.0);
    fm3 /= 4.0;
    EXPECT_EQ(fm3.value(), 1.0);

    auto v = fm3 *= 2.0;
    EXPECT_EQ(v.value(), 2.0);
}